

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_remove_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  _Bool _Var1;
  uint16_t val;
  long in_RDX;
  container_t *in_RSI;
  roaring_array_t *in_RDI;
  container_t *new_container;
  uint8_t new_typecode;
  uint16_t key;
  size_t i;
  int32_t pos;
  roaring_array_t *in_stack_ffffffffffffffc8;
  undefined5 in_stack_ffffffffffffffd0;
  uint8_t in_stack_ffffffffffffffd5;
  container_t *c;
  int local_1c;
  
  if ((in_RSI != (container_t *)0x0) && (in_RDI->size != 0)) {
    local_1c = -1;
    for (c = (container_t *)0x0; c < in_RSI; c = (container_t *)((long)c + 1)) {
      val = (uint16_t)((uint)*(undefined4 *)(in_RDX + (long)c * 4) >> 0x10);
      if ((local_1c < 0) || (val != in_RDI->keys[local_1c])) {
        local_1c = ra_get_index(in_stack_ffffffffffffffc8,0);
      }
      if (-1 < local_1c) {
        in_stack_ffffffffffffffc8 =
             (roaring_array_t *)
             container_remove(c,val,in_stack_ffffffffffffffd5,(uint8_t *)in_stack_ffffffffffffffc8);
        if (in_stack_ffffffffffffffc8 != (roaring_array_t *)in_RDI->containers[local_1c]) {
          container_free((container_t *)
                         CONCAT26(val,CONCAT15(in_stack_ffffffffffffffd5,in_stack_ffffffffffffffd0))
                         ,(uint8_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
          ra_replace_key_and_container_at_index
                    (in_RDI,local_1c,val,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd5);
        }
        _Var1 = container_nonzero_cardinality(in_stack_ffffffffffffffc8,'\0');
        if (!_Var1) {
          container_free((container_t *)
                         CONCAT26(val,CONCAT15(in_stack_ffffffffffffffd5,in_stack_ffffffffffffffd0))
                         ,(uint8_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
          ra_remove_at_index((roaring_array_t *)
                             CONCAT26(val,CONCAT15(in_stack_ffffffffffffffd5,
                                                   in_stack_ffffffffffffffd0)),
                             (int32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
          local_1c = -1;
        }
      }
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove_many(roaring_bitmap_t *r, size_t n_args,
                                const uint32_t *vals) {
    if (n_args == 0 || r->high_low_container.size == 0) {
        return;
    }
    int32_t pos =
        -1;  // position of the container used in the previous iteration
    for (size_t i = 0; i < n_args; i++) {
        uint16_t key = (uint16_t)(vals[i] >> 16);
        if (pos < 0 || key != r->high_low_container.keys[pos]) {
            pos = ra_get_index(&r->high_low_container, key);
        }
        if (pos >= 0) {
            uint8_t new_typecode;
            container_t *new_container;
            new_container = container_remove(
                r->high_low_container.containers[pos], vals[i] & 0xffff,
                r->high_low_container.typecodes[pos], &new_typecode);
            if (new_container != r->high_low_container.containers[pos]) {
                container_free(r->high_low_container.containers[pos],
                               r->high_low_container.typecodes[pos]);
                ra_replace_key_and_container_at_index(&r->high_low_container,
                                                      pos, key, new_container,
                                                      new_typecode);
            }
            if (!container_nonzero_cardinality(new_container, new_typecode)) {
                container_free(new_container, new_typecode);
                ra_remove_at_index(&r->high_low_container, pos);
                pos = -1;
            }
        }
    }
}